

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cc
# Opt level: O2

void conjugate_gradient_test(void)

{
  int i;
  long lVar1;
  vector<double,_std::allocator<double>_> x;
  vector<double,_std::allocator<double>_> b;
  vector<double,_std::allocator<double>_> c;
  SparseMatrix a;
  SparseMatrix local_50;
  
  puts("conjugate_gradient_test {");
  SparseMatrix::SparseMatrix(&a,4,2);
  SparseMatrix::set_element(&a,0,0,1.0);
  SparseMatrix::set_element(&a,0,1,2.0);
  SparseMatrix::set_element(&a,1,0,2.0);
  SparseMatrix::set_element(&a,1,1,-3.0);
  SparseMatrix::set_element(&a,2,0,4.0);
  SparseMatrix::set_element(&a,2,1,-1.0);
  SparseMatrix::set_element(&a,3,0,-5.0);
  SparseMatrix::set_element(&a,3,1,2.0);
  std::vector<double,_std::allocator<double>_>::vector(&b,4,(allocator_type *)&local_50);
  *b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       3.0;
  b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start[1]
       = 2.0;
  b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start[2]
       = -4.0;
  b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start[3]
       = 5.0;
  std::vector<double,_std::allocator<double>_>::vector(&x,2,(allocator_type *)&local_50);
  *x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       0.0;
  x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start[1]
       = 0.0;
  Math::conjugate_gradient
            (&a,b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start,2,
             x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start);
  std::vector<double,_std::allocator<double>_>::vector(&c,4,(allocator_type *)&local_50);
  SparseMatrix::multiply_column
            (&a,x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start,
             c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start);
  printf("x: %lf %lf\n",
         SUB84(*x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start,0),
         x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[1]);
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    printf(" %lf(%lf)",
           SUB84(c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar1],0),
           b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar1]);
  }
  putchar(10);
  SparseMatrix::SparseMatrix(&local_50,1,2);
  SparseMatrix::operator=(&a,&local_50);
  SparseMatrix::~SparseMatrix(&local_50);
  SparseMatrix::set_element(&a,0,0,1.0);
  SparseMatrix::set_element(&a,0,1,2.0);
  std::vector<double,_std::allocator<double>_>::resize(&b,1);
  *b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       3.0;
  *x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       7.0;
  x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start[1]
       = -3.0;
  Math::conjugate_gradient
            (&a,b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start,1,
             x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start);
  std::vector<double,_std::allocator<double>_>::resize(&c,1);
  SparseMatrix::multiply_column
            (&a,x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start,
             c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start);
  printf("x: %lf %lf\n",
         SUB84(*x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start,0),
         x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[1]);
  printf(" %lf(%lf)",
         SUB84(*c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start,0),
         *b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start);
  putchar(10);
  puts("} conjugate_gradient_test");
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&c.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&x.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&b.super__Vector_base<double,_std::allocator<double>_>);
  SparseMatrix::~SparseMatrix(&a);
  return;
}

Assistant:

void conjugate_gradient_test() {
  printf("conjugate_gradient_test {\n");

  // Test Case 1
  SparseMatrix a(4, 2);
  a.set_element(0, 0, 1.0);
  a.set_element(0, 1, 2.0);

  a.set_element(1, 0, 2.0);
  a.set_element(1, 1, -3.0);

  a.set_element(2, 0, 4.0);
  a.set_element(2, 1, -1.0);

  a.set_element(3, 0, -5.0);
  a.set_element(3, 1, 2.0);

  // Suppose solution is (2, 3).
  std::vector<double> b(4);
  b[0] = 3.0;  // 8.0
  b[1] = 2.0;  // -5.0
  b[2] = -4.0;
  b[3] = 5.0;

  std::vector<double> x(2);
  x[0] = x[1] = 0.0;

  Math::conjugate_gradient(a, &b[0], 2, &x[0]);

  std::vector<double> c(4);
  a.multiply_column(&x[0], &c[0]);

  printf("x: %lf %lf\n", x[0], x[1]);

  for (int i = 0; i < 4; i++) {
    printf(" %lf(%lf)", c[i], b[i]);
  }
  printf("\n");

  // Test Case 2
  a = SparseMatrix(1, 2);
  a.set_element(0, 0, 1.0);
  a.set_element(0, 1, 2.0);

  b.resize(1);
  b[0] = 3.0;

  // x[0] = x[1] = 0.0;
  x[0] = 7.0;
  x[1] = -3.0;

  Math::conjugate_gradient(a, &b[0], 1, &x[0]);

  c.resize(1);
  a.multiply_column(&x[0], &c[0]);

  printf("x: %lf %lf\n", x[0], x[1]);

  for (int i = 0; i < 1; i++) {
    printf(" %lf(%lf)", c[i], b[i]);
  }
  printf("\n");

  printf("} conjugate_gradient_test\n");
}